

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

int tcu::astc::anon_unknown_0::computeNumBitsForColorEndpoints(NormalBlockParams *params)

{
  int iVar1;
  int iVar2;
  int local_28;
  int local_24;
  int numConfigDataBits;
  int numWeightBits;
  NormalBlockParams *params_local;
  
  iVar1 = computeNumWeights(params);
  iVar1 = computeNumRequiredBits(&params->weightISEParams,iVar1);
  if (params->numPartitions == 1) {
    local_24 = 0x11;
  }
  else {
    if ((params->isMultiPartSingleCemMode & 1U) == 0) {
      local_28 = params->numPartitions * 3 + 0x19;
    }
    else {
      local_28 = 0x1d;
    }
    local_24 = local_28;
  }
  iVar2 = 0;
  if ((params->isDualPlane & 1U) != 0) {
    iVar2 = 2;
  }
  return (0x80 - iVar1) - (local_24 + iVar2);
}

Assistant:

static inline int computeNumBitsForColorEndpoints (const NormalBlockParams& params)
{
	const int numWeightBits			= computeNumRequiredBits(params.weightISEParams, computeNumWeights(params));
	const int numConfigDataBits		= (params.numPartitions == 1 ? 17 : params.isMultiPartSingleCemMode ? 29 : 25 + 3*params.numPartitions) +
									  (params.isDualPlane ? 2 : 0);

	return 128 - numWeightBits - numConfigDataBits;
}